

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transactions.cpp
# Opt level: O3

vector<RPCResult,_std::allocator<RPCResult>_> * wallet::TransactionDescriptionString(void)

{
  size_type *psVar1;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  string m_key_name_07;
  string m_key_name_08;
  string m_key_name_09;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  string description_11;
  string description_12;
  string description_13;
  string description_14;
  string description_15;
  string description_16;
  string description_17;
  string description_18;
  string description_19;
  string description_20;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_11;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_12;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_13;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_14;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_15;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_16;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_17;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_18;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_19;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_20;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_RDI;
  long lVar15;
  long in_FS_OFFSET;
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  undefined4 in_stack_ffffffffffffeb88;
  undefined4 uVar16;
  undefined1 in_stack_ffffffffffffeb8c [28];
  pointer in_stack_ffffffffffffeba8;
  pointer pRVar17;
  pointer in_stack_ffffffffffffebb0;
  pointer pRVar18;
  pointer in_stack_ffffffffffffebb8;
  pointer pRVar19;
  pointer in_stack_ffffffffffffebc0;
  undefined1 in_stack_ffffffffffffebc8 [16];
  pointer in_stack_ffffffffffffebd8;
  pointer pRVar20;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1408;
  vector<RPCResult,_std::allocator<RPCResult>_> local_13e8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_13c8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_13a8;
  allocator_type local_1389;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1388;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1370;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1358;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1338;
  allocator_type local_1319;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1318;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1300;
  vector<RPCResult,_std::allocator<RPCResult>_> local_12e8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_12c8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_12a8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1288;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1268;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1248;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1228;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1208;
  vector<RPCResult,_std::allocator<RPCResult>_> local_11e8;
  long *local_11c8 [2];
  long local_11b8 [2];
  long *local_11a8 [2];
  long local_1198 [2];
  RPCResult local_1188;
  long *local_1100 [2];
  long local_10f0 [2];
  long *local_10e0 [2];
  long local_10d0 [2];
  long *local_10c0 [2];
  long local_10b0 [2];
  long *local_10a0 [2];
  long local_1090 [2];
  long *local_1080 [2];
  long local_1070 [2];
  long *local_1060 [2];
  long local_1050 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1040;
  size_type *local_1020;
  size_type local_1018;
  size_type local_1010;
  undefined8 uStack_1008;
  long *local_1000 [2];
  long local_ff0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fe0;
  size_type *local_fc0;
  size_type local_fb8;
  size_type local_fb0;
  undefined8 uStack_fa8;
  long *local_fa0 [2];
  long local_f90 [2];
  long *local_f80 [2];
  long local_f70 [2];
  long *local_f60 [2];
  long local_f50 [2];
  long *local_f40 [2];
  long local_f30 [2];
  long *local_f20 [2];
  long local_f10 [2];
  RPCResult local_f00;
  long *local_e78 [2];
  long local_e68 [2];
  long *local_e58 [2];
  long local_e48 [2];
  long *local_e38 [2];
  long local_e28 [2];
  long *local_e18 [2];
  long local_e08 [2];
  long *local_df8 [2];
  long local_de8 [2];
  long *local_dd8 [2];
  long local_dc8 [2];
  long *local_db8 [2];
  long local_da8 [2];
  long *local_d98 [2];
  long local_d88 [2];
  RPCResult local_d78;
  long *local_cf0 [2];
  long local_ce0 [2];
  long *local_cd0 [2];
  long local_cc0 [2];
  long *local_cb0 [2];
  long local_ca0 [2];
  long *local_c90 [2];
  long local_c80 [2];
  long *local_c70 [2];
  long local_c60 [2];
  long *local_c50 [2];
  long local_c40 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c30;
  size_type *local_c10;
  size_type local_c08;
  size_type local_c00;
  undefined8 uStack_bf8;
  long *local_bf0 [2];
  long local_be0 [2];
  long *local_bd0 [2];
  long local_bc0 [2];
  long *local_bb0 [2];
  long local_ba0 [2];
  long *local_b90 [2];
  long local_b80 [2];
  long *local_b70 [2];
  long local_b60 [2];
  long *local_b50 [2];
  long local_b40 [2];
  long *local_b30 [2];
  long local_b20 [2];
  long *local_b10 [2];
  long local_b00 [2];
  long *local_af0 [2];
  long local_ae0 [2];
  long *local_ad0 [2];
  long local_ac0 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_ab0;
  long *local_a90 [2];
  long local_a80 [2];
  pointer local_a70 [2];
  undefined1 local_a60 [152];
  RPCResult local_9c8;
  RPCResult local_940;
  RPCResult local_8b8;
  RPCResult local_830;
  RPCResult local_7a8;
  RPCResult local_720;
  RPCResult local_698;
  RPCResult local_610;
  RPCResult local_588;
  RPCResult local_500;
  RPCResult local_478;
  RPCResult local_3f0;
  RPCResult local_368;
  RPCResult local_2e0;
  RPCResult local_258;
  RPCResult local_1d0;
  RPCResult local_148;
  RPCResult local_c0;
  vector<RPCResult,_std::allocator<RPCResult>_> *local_38;
  
  local_1040.field_2._M_allocated_capacity = 0;
  local_38 = *(vector<RPCResult,_std::allocator<RPCResult>_> **)(in_FS_OFFSET + 0x28);
  local_a70[0] = (pointer)local_a60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a70,"confirmations","");
  local_a90[0] = local_a80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a90,
             "The number of confirmations for the transaction. Negative confirmations means the\ntransaction conflicted that many blocks ago."
             ,"");
  local_11e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_11e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_11e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._4_28_ = in_stack_ffffffffffffeb8c;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeb88;
  description._M_string_length = (size_type)in_stack_ffffffffffffebb0;
  description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeba8;
  description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffebb8;
  description.field_2._8_8_ = in_stack_ffffffffffffebc0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffebd8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffebc8._0_8_;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffebc8._8_8_;
  ::RPCResult::RPCResult
            ((RPCResult *)(local_a60 + 0x10),NUM,m_key_name,description,inner,SUB81(local_a70,0));
  local_ab0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_ab0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ab0,"generated","");
  local_ad0[0] = local_ac0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ad0,"Only present if the transaction\'s only input is a coinbase one.",
             "");
  local_1208.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1208.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1208.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar2._28_4_ = 0;
  auVar2._0_28_ = in_stack_ffffffffffffeb8c;
  description_00._M_string_length = (size_type)in_stack_ffffffffffffebb0;
  description_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeba8;
  description_00.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffebb8;
  description_00.field_2._8_8_ = in_stack_ffffffffffffebc0;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebd8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffebc8._0_8_;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffebc8._8_8_;
  ::RPCResult::RPCResult
            (&local_9c8,BOOL,(string)(auVar2 << 0x20),SUB81(&local_ab0,0),description_00,inner_00,
             true);
  local_af0[0] = local_ae0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_af0,"trusted","");
  local_b10[0] = local_b00;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b10,
             "Whether we consider the transaction to be trusted and safe to spend from.\nOnly present when the transaction has 0 confirmations (or negative confirmations, if conflicted)."
             ,"");
  local_1228.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1228.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1228.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar3._28_4_ = 0;
  auVar3._0_28_ = in_stack_ffffffffffffeb8c;
  description_01._M_string_length = (size_type)in_stack_ffffffffffffebb0;
  description_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeba8;
  description_01.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffebb8;
  description_01.field_2._8_8_ = in_stack_ffffffffffffebc0;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebd8;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffebc8._0_8_;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffebc8._8_8_;
  ::RPCResult::RPCResult
            (&local_940,BOOL,(string)(auVar3 << 0x20),SUB81(local_af0,0),description_01,inner_01,
             true);
  local_b30[0] = local_b20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b30,"blockhash","");
  local_b50[0] = local_b40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b50,"The block hash containing the transaction.","");
  local_1248.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1248.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1248.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar4._28_4_ = 0;
  auVar4._0_28_ = in_stack_ffffffffffffeb8c;
  description_02._M_string_length = (size_type)in_stack_ffffffffffffebb0;
  description_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeba8;
  description_02.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffebb8;
  description_02.field_2._8_8_ = in_stack_ffffffffffffebc0;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebd8;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffebc8._0_8_;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffebc8._8_8_;
  ::RPCResult::RPCResult
            (&local_8b8,STR_HEX,(string)(auVar4 << 0x20),SUB81(local_b30,0),description_02,inner_02,
             true);
  local_b70[0] = local_b60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b70,"blockheight","");
  local_b90[0] = local_b80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b90,"The block height containing the transaction.","");
  local_1268.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1268.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1268.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar5._28_4_ = 0;
  auVar5._0_28_ = in_stack_ffffffffffffeb8c;
  description_03._M_string_length = (size_type)in_stack_ffffffffffffebb0;
  description_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeba8;
  description_03.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffebb8;
  description_03.field_2._8_8_ = in_stack_ffffffffffffebc0;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebd8;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffebc8._0_8_;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffebc8._8_8_;
  ::RPCResult::RPCResult
            (&local_830,NUM,(string)(auVar5 << 0x20),SUB81(local_b70,0),description_03,inner_03,true
            );
  local_bb0[0] = local_ba0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_bb0,"blockindex","");
  local_bd0[0] = local_bc0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_bd0,"The index of the transaction in the block that includes it.","");
  local_1288.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1288.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1288.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar6._28_4_ = 0;
  auVar6._0_28_ = in_stack_ffffffffffffeb8c;
  description_04._M_string_length = (size_type)in_stack_ffffffffffffebb0;
  description_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeba8;
  description_04.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffebb8;
  description_04.field_2._8_8_ = in_stack_ffffffffffffebc0;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebd8;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffebc8._0_8_;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffebc8._8_8_;
  ::RPCResult::RPCResult
            (&local_7a8,NUM,(string)(auVar6 << 0x20),SUB81(local_bb0,0),description_04,inner_04,true
            );
  local_bf0[0] = local_be0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_bf0,"blocktime","");
  std::operator+(&local_c30,"The block time expressed in ",&UNIX_EPOCH_TIME_abi_cxx11_);
  pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_c30,".");
  local_c10 = &local_c00;
  psVar1 = (size_type *)(pbVar13->_M_dataplus)._M_p;
  paVar14 = &pbVar13->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar14) {
    local_c00 = paVar14->_M_allocated_capacity;
    uStack_bf8 = *(undefined8 *)((long)&pbVar13->field_2 + 8);
  }
  else {
    local_c00 = paVar14->_M_allocated_capacity;
    local_c10 = psVar1;
  }
  local_c08 = pbVar13->_M_string_length;
  (pbVar13->_M_dataplus)._M_p = (pointer)paVar14;
  pbVar13->_M_string_length = 0;
  (pbVar13->field_2)._M_local_buf[0] = '\0';
  local_12a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_12a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_12a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar16 = 0;
  auVar7._28_4_ = 0;
  auVar7._0_28_ = in_stack_ffffffffffffeb8c;
  description_05._M_string_length = (size_type)in_stack_ffffffffffffebb0;
  description_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeba8;
  description_05.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffebb8;
  description_05.field_2._8_8_ = in_stack_ffffffffffffebc0;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebd8;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffebc8._0_8_;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffebc8._8_8_;
  ::RPCResult::RPCResult
            (&local_720,NUM_TIME,(string)(auVar7 << 0x20),SUB81(local_bf0,0),description_05,inner_05
             ,true);
  local_c50[0] = local_c40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c50,"txid","");
  local_c70[0] = local_c60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c70,"The transaction id.","");
  local_12c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_12c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_12c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._4_28_ = in_stack_ffffffffffffeb8c;
  m_key_name_00._M_dataplus._M_p._0_4_ = uVar16;
  description_06._M_string_length = (size_type)in_stack_ffffffffffffebb0;
  description_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeba8;
  description_06.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffebb8;
  description_06.field_2._8_8_ = in_stack_ffffffffffffebc0;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebd8;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffebc8._0_8_;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffebc8._8_8_;
  ::RPCResult::RPCResult
            (&local_698,STR_HEX,m_key_name_00,description_06,inner_06,SUB81(local_c50,0));
  local_c90[0] = local_c80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c90,"wtxid","");
  local_cb0[0] = local_ca0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_cb0,"The hash of serialized transaction, including witness data.","");
  local_12e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_12e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_12e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._4_28_ = in_stack_ffffffffffffeb8c;
  m_key_name_01._M_dataplus._M_p._0_4_ = uVar16;
  description_07._M_string_length = (size_type)in_stack_ffffffffffffebb0;
  description_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeba8;
  description_07.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffebb8;
  description_07.field_2._8_8_ = in_stack_ffffffffffffebc0;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebd8;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffebc8._0_8_;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffebc8._8_8_;
  ::RPCResult::RPCResult
            (&local_610,STR_HEX,m_key_name_01,description_07,inner_07,SUB81(local_c90,0));
  local_cd0[0] = local_cc0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_cd0,"walletconflicts","");
  local_cf0[0] = local_ce0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_cf0,
             "Confirmed transactions that have been detected by the wallet to conflict with this transaction."
             ,"");
  local_d98[0] = local_d88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d98,"txid","");
  local_db8[0] = local_da8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_db8,"The transaction id.","");
  local_1318.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1318.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1318.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_02._4_28_ = in_stack_ffffffffffffeb8c;
  m_key_name_02._M_dataplus._M_p._0_4_ = uVar16;
  description_08._M_string_length = (size_type)in_stack_ffffffffffffebb0;
  description_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeba8;
  description_08.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffebb8;
  description_08.field_2._8_8_ = in_stack_ffffffffffffebc0;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebd8;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffebc8._0_8_;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffebc8._8_8_;
  ::RPCResult::RPCResult
            (&local_d78,STR_HEX,m_key_name_02,description_08,inner_08,SUB81(local_d98,0));
  __l._M_len = 1;
  __l._M_array = &local_d78;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_1300,__l,&local_1319);
  m_key_name_03._4_28_ = in_stack_ffffffffffffeb8c;
  m_key_name_03._M_dataplus._M_p._0_4_ = uVar16;
  description_09._M_string_length = (size_type)in_stack_ffffffffffffebb0;
  description_09._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeba8;
  description_09.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffebb8;
  description_09.field_2._8_8_ = in_stack_ffffffffffffebc0;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebd8;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffebc8._0_8_;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffebc8._8_8_;
  ::RPCResult::RPCResult(&local_588,ARR,m_key_name_03,description_09,inner_09,SUB81(local_cd0,0));
  local_dd8[0] = local_dc8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_dd8,"replaced_by_txid","");
  local_df8[0] = local_de8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_df8,
             "Only if \'category\' is \'send\'. The txid if this tx was replaced.","");
  local_1338.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1338.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1338.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar8._28_4_ = 0;
  auVar8._0_28_ = in_stack_ffffffffffffeb8c;
  description_10._M_string_length = (size_type)in_stack_ffffffffffffebb0;
  description_10._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeba8;
  description_10.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffebb8;
  description_10.field_2._8_8_ = in_stack_ffffffffffffebc0;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebd8;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffebc8._0_8_;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffebc8._8_8_;
  ::RPCResult::RPCResult
            (&local_500,STR_HEX,(string)(auVar8 << 0x20),SUB81(local_dd8,0),description_10,inner_10,
             true);
  local_e18[0] = local_e08;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e18,"replaces_txid","");
  local_e38[0] = local_e28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e38,
             "Only if \'category\' is \'send\'. The txid if this tx replaces another.","");
  local_1358.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1358.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1358.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar16 = 0;
  auVar9._28_4_ = 0;
  auVar9._0_28_ = in_stack_ffffffffffffeb8c;
  description_11._M_string_length = (size_type)in_stack_ffffffffffffebb0;
  description_11._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeba8;
  description_11.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffebb8;
  description_11.field_2._8_8_ = in_stack_ffffffffffffebc0;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebd8;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffebc8._0_8_;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffebc8._8_8_;
  ::RPCResult::RPCResult
            (&local_478,STR_HEX,(string)(auVar9 << 0x20),SUB81(local_e18,0),description_11,inner_11,
             true);
  local_e58[0] = local_e48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e58,"mempoolconflicts","");
  local_e78[0] = local_e68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e78,
             "Transactions in the mempool that directly conflict with either this transaction or an ancestor transaction"
             ,"");
  local_f20[0] = local_f10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f20,"txid","");
  local_f40[0] = local_f30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f40,"The transaction id.","");
  local_1388.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1388.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1388.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_04._4_28_ = in_stack_ffffffffffffeb8c;
  m_key_name_04._M_dataplus._M_p._0_4_ = uVar16;
  description_12._M_string_length = (size_type)in_stack_ffffffffffffebb0;
  description_12._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeba8;
  description_12.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffebb8;
  description_12.field_2._8_8_ = in_stack_ffffffffffffebc0;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebd8;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffebc8._0_8_;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffebc8._8_8_;
  ::RPCResult::RPCResult
            (&local_f00,STR_HEX,m_key_name_04,description_12,inner_12,SUB81(local_f20,0));
  __l_00._M_len = 1;
  __l_00._M_array = &local_f00;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_1370,__l_00,&local_1389);
  m_key_name_05._4_28_ = in_stack_ffffffffffffeb8c;
  m_key_name_05._M_dataplus._M_p._0_4_ = uVar16;
  description_13._M_string_length = (size_type)in_stack_ffffffffffffebb0;
  description_13._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeba8;
  description_13.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffebb8;
  description_13.field_2._8_8_ = in_stack_ffffffffffffebc0;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebd8;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffebc8._0_8_;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffebc8._8_8_;
  ::RPCResult::RPCResult(&local_3f0,ARR,m_key_name_05,description_13,inner_13,SUB81(local_e58,0));
  local_f60[0] = local_f50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f60,"to","");
  local_f80[0] = local_f70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f80,"If a comment to is associated with the transaction.","");
  local_13a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_13a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_13a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar16 = 0;
  auVar10._28_4_ = 0;
  auVar10._0_28_ = in_stack_ffffffffffffeb8c;
  description_14._M_string_length = (size_type)in_stack_ffffffffffffebb0;
  description_14._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeba8;
  description_14.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffebb8;
  description_14.field_2._8_8_ = in_stack_ffffffffffffebc0;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebd8;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffebc8._0_8_;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffebc8._8_8_;
  ::RPCResult::RPCResult
            (&local_368,STR,(string)(auVar10 << 0x20),SUB81(local_f60,0),description_14,inner_14,
             true);
  local_fa0[0] = local_f90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_fa0,"time","");
  std::operator+(&local_fe0,"The transaction time expressed in ",&UNIX_EPOCH_TIME_abi_cxx11_);
  pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_fe0,".");
  local_fc0 = &local_fb0;
  psVar1 = (size_type *)(pbVar13->_M_dataplus)._M_p;
  paVar14 = &pbVar13->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar14) {
    local_fb0 = paVar14->_M_allocated_capacity;
    uStack_fa8 = *(undefined8 *)((long)&pbVar13->field_2 + 8);
  }
  else {
    local_fb0 = paVar14->_M_allocated_capacity;
    local_fc0 = psVar1;
  }
  local_fb8 = pbVar13->_M_string_length;
  (pbVar13->_M_dataplus)._M_p = (pointer)paVar14;
  pbVar13->_M_string_length = 0;
  (pbVar13->field_2)._M_local_buf[0] = '\0';
  local_13c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_13c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_13c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  m_key_name_06._4_28_ = in_stack_ffffffffffffeb8c;
  m_key_name_06._M_dataplus._M_p._0_4_ = uVar16;
  description_15._M_string_length = (size_type)in_stack_ffffffffffffebb0;
  description_15._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeba8;
  description_15.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffebb8;
  description_15.field_2._8_8_ = in_stack_ffffffffffffebc0;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebd8;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffebc8._0_8_;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffebc8._8_8_;
  ::RPCResult::RPCResult
            (&local_2e0,NUM_TIME,m_key_name_06,description_15,inner_15,SUB81(local_fa0,0));
  local_1000[0] = local_ff0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1000,"timereceived","");
  std::operator+(&local_1040,"The time received expressed in ",&UNIX_EPOCH_TIME_abi_cxx11_);
  pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_1040,".");
  local_1020 = &local_1010;
  psVar1 = (size_type *)(pbVar13->_M_dataplus)._M_p;
  paVar14 = &pbVar13->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar14) {
    local_1010 = paVar14->_M_allocated_capacity;
    uStack_1008 = *(undefined8 *)((long)&pbVar13->field_2 + 8);
  }
  else {
    local_1010 = paVar14->_M_allocated_capacity;
    local_1020 = psVar1;
  }
  local_1018 = pbVar13->_M_string_length;
  (pbVar13->_M_dataplus)._M_p = (pointer)paVar14;
  pbVar13->_M_string_length = 0;
  (pbVar13->field_2)._M_local_buf[0] = '\0';
  local_13e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_13e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_13e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  m_key_name_07._4_28_ = in_stack_ffffffffffffeb8c;
  m_key_name_07._M_dataplus._M_p._0_4_ = uVar16;
  description_16._M_string_length = (size_type)in_stack_ffffffffffffebb0;
  description_16._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeba8;
  description_16.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffebb8;
  description_16.field_2._8_8_ = in_stack_ffffffffffffebc0;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebd8;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffebc8._0_8_;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffebc8._8_8_;
  ::RPCResult::RPCResult(&local_258,NUM_TIME,m_key_name_07,description_16,inner_16,false);
  local_1060[0] = local_1050;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1060,"comment","");
  local_1080[0] = local_1070;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1080,
             "If a comment is associated with the transaction, only present if not empty.","");
  local_1408.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1408.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1408.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar16 = 0;
  auVar11._28_4_ = 0;
  auVar11._0_28_ = in_stack_ffffffffffffeb8c;
  description_17._M_string_length = (size_type)in_stack_ffffffffffffebb0;
  description_17._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeba8;
  description_17.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffebb8;
  description_17.field_2._8_8_ = in_stack_ffffffffffffebc0;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffebd8;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffebc8._0_8_;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffebc8._8_8_;
  ::RPCResult::RPCResult
            (&local_1d0,STR,(string)(auVar11 << 0x20),SUB81(local_1060,0),description_17,inner_17,
             true);
  local_10a0[0] = local_1090;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_10a0,"bip125-replaceable","");
  local_10c0[0] = local_10b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_10c0,
             "(\"yes|no|unknown\") Whether this transaction signals BIP125 replaceability or has an unconfirmed ancestor signaling BIP125 replaceability.\nMay be unknown for unconfirmed transactions not in the mempool because their unconfirmed ancestors are unknown."
             ,"");
  pRVar20 = (pointer)0x0;
  m_key_name_08._4_28_ = in_stack_ffffffffffffeb8c;
  m_key_name_08._M_dataplus._M_p._0_4_ = uVar16;
  description_18._M_string_length = (size_type)in_stack_ffffffffffffebb0;
  description_18._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeba8;
  description_18.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffebb8;
  description_18.field_2._8_8_ = in_stack_ffffffffffffebc0;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffebc8._0_8_;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffebc8._8_8_;
  ::RPCResult::RPCResult(&local_148,STR,m_key_name_08,description_18,inner_18,SUB81(local_10a0,0));
  local_10e0[0] = local_10d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_10e0,"parent_descs","");
  local_1100[0] = local_10f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1100,
             "Only if \'category\' is \'received\'. List of parent descriptors for the output script of this coin."
             ,"");
  local_11a8[0] = local_1198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_11a8,"desc","");
  local_11c8[0] = local_11b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_11c8,"The descriptor string.","");
  pRVar17 = (pointer)0x0;
  pRVar18 = (pointer)0x0;
  pRVar19 = (pointer)0x0;
  m_key_name_09._4_28_ = in_stack_ffffffffffffeb8c;
  m_key_name_09._M_dataplus._M_p._0_4_ = uVar16;
  description_19.field_2._M_allocated_capacity = 0;
  description_19._M_dataplus._M_p = (pointer)0x0;
  description_19._M_string_length = 0;
  description_19.field_2._8_8_ = in_stack_ffffffffffffebc0;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = pRVar20;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffebc8._0_8_;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffebc8._8_8_;
  ::RPCResult::RPCResult(&local_1188,STR,m_key_name_09,description_19,inner_19,SUB81(local_11a8,0));
  __l_01._M_len = 1;
  __l_01._M_array = &local_1188;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffebc0,__l_01,
             (allocator_type *)&stack0xffffffffffffeba7);
  auVar12._28_4_ = 0;
  auVar12._0_28_ = in_stack_ffffffffffffeb8c;
  description_20._M_string_length = (size_type)pRVar18;
  description_20._M_dataplus._M_p = (pointer)pRVar17;
  description_20.field_2._M_allocated_capacity = (size_type)pRVar19;
  description_20.field_2._8_8_ = in_stack_ffffffffffffebc0;
  inner_20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = pRVar20;
  inner_20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffebc8._0_8_;
  inner_20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffebc8._8_8_;
  ::RPCResult::RPCResult
            (&local_c0,ARR,(string)(auVar12 << 0x20),SUB81(local_10e0,0),description_20,inner_20,
             true);
  __l_02._M_len = 0x13;
  __l_02._M_array = (iterator)(local_a60 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (in_RDI,__l_02,(allocator_type *)&stack0xffffffffffffeba6);
  lVar15 = 0xa18;
  do {
    if ((long *)(local_a60 + lVar15) != *(long **)((long)local_a70 + lVar15)) {
      operator_delete(*(long **)((long)local_a70 + lVar15),*(long *)(local_a60 + lVar15) + 1);
    }
    if ((long *)((long)local_a80 + lVar15) != *(long **)((long)local_a90 + lVar15)) {
      operator_delete(*(long **)((long)local_a90 + lVar15),*(long *)((long)local_a80 + lVar15) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_ab0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar15));
    if ((long *)((long)local_ac0 + lVar15) != *(long **)((long)local_ad0 + lVar15)) {
      operator_delete(*(long **)((long)local_ad0 + lVar15),*(long *)((long)local_ac0 + lVar15) + 1);
    }
    lVar15 = lVar15 + -0x88;
  } while (lVar15 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffebc0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1188.m_cond._M_dataplus._M_p != &local_1188.m_cond.field_2) {
    operator_delete(local_1188.m_cond._M_dataplus._M_p,
                    local_1188.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1188.m_description._M_dataplus._M_p != &local_1188.m_description.field_2) {
    operator_delete(local_1188.m_description._M_dataplus._M_p,
                    local_1188.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1188.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1188.m_key_name._M_dataplus._M_p != &local_1188.m_key_name.field_2) {
    operator_delete(local_1188.m_key_name._M_dataplus._M_p,
                    local_1188.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffeba8);
  if (local_11c8[0] != local_11b8) {
    operator_delete(local_11c8[0],local_11b8[0] + 1);
  }
  if (local_11a8[0] != local_1198) {
    operator_delete(local_11a8[0],local_1198[0] + 1);
  }
  if (local_1100[0] != local_10f0) {
    operator_delete(local_1100[0],local_10f0[0] + 1);
  }
  if (local_10e0[0] != local_10d0) {
    operator_delete(local_10e0[0],local_10d0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffebd8);
  if (local_10c0[0] != local_10b0) {
    operator_delete(local_10c0[0],local_10b0[0] + 1);
  }
  if (local_10a0[0] != local_1090) {
    operator_delete(local_10a0[0],local_1090[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1408);
  if (local_1080[0] != local_1070) {
    operator_delete(local_1080[0],local_1070[0] + 1);
  }
  if (local_1060[0] != local_1050) {
    operator_delete(local_1060[0],local_1050[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_13e8);
  if (local_1020 != &local_1010) {
    operator_delete(local_1020,local_1010 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1040._M_dataplus._M_p != &local_1040.field_2) {
    operator_delete(local_1040._M_dataplus._M_p,local_1040.field_2._M_allocated_capacity + 1);
  }
  if (local_1000[0] != local_ff0) {
    operator_delete(local_1000[0],local_ff0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_13c8);
  if (local_fc0 != &local_fb0) {
    operator_delete(local_fc0,local_fb0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fe0._M_dataplus._M_p != &local_fe0.field_2) {
    operator_delete(local_fe0._M_dataplus._M_p,local_fe0.field_2._M_allocated_capacity + 1);
  }
  if (local_fa0[0] != local_f90) {
    operator_delete(local_fa0[0],local_f90[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_13a8);
  if (local_f80[0] != local_f70) {
    operator_delete(local_f80[0],local_f70[0] + 1);
  }
  if (local_f60[0] != local_f50) {
    operator_delete(local_f60[0],local_f50[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1370);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f00.m_cond._M_dataplus._M_p != &local_f00.m_cond.field_2) {
    operator_delete(local_f00.m_cond._M_dataplus._M_p,
                    local_f00.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f00.m_description._M_dataplus._M_p != &local_f00.m_description.field_2) {
    operator_delete(local_f00.m_description._M_dataplus._M_p,
                    local_f00.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_f00.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f00.m_key_name._M_dataplus._M_p != &local_f00.m_key_name.field_2) {
    operator_delete(local_f00.m_key_name._M_dataplus._M_p,
                    local_f00.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1388);
  if (local_f40[0] != local_f30) {
    operator_delete(local_f40[0],local_f30[0] + 1);
  }
  if (local_f20[0] != local_f10) {
    operator_delete(local_f20[0],local_f10[0] + 1);
  }
  if (local_e78[0] != local_e68) {
    operator_delete(local_e78[0],local_e68[0] + 1);
  }
  if (local_e58[0] != local_e48) {
    operator_delete(local_e58[0],local_e48[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1358);
  if (local_e38[0] != local_e28) {
    operator_delete(local_e38[0],local_e28[0] + 1);
  }
  if (local_e18[0] != local_e08) {
    operator_delete(local_e18[0],local_e08[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1338);
  if (local_df8[0] != local_de8) {
    operator_delete(local_df8[0],local_de8[0] + 1);
  }
  if (local_dd8[0] != local_dc8) {
    operator_delete(local_dd8[0],local_dc8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1300);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d78.m_cond._M_dataplus._M_p != &local_d78.m_cond.field_2) {
    operator_delete(local_d78.m_cond._M_dataplus._M_p,
                    local_d78.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d78.m_description._M_dataplus._M_p != &local_d78.m_description.field_2) {
    operator_delete(local_d78.m_description._M_dataplus._M_p,
                    local_d78.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_d78.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d78.m_key_name._M_dataplus._M_p != &local_d78.m_key_name.field_2) {
    operator_delete(local_d78.m_key_name._M_dataplus._M_p,
                    local_d78.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1318);
  if (local_db8[0] != local_da8) {
    operator_delete(local_db8[0],local_da8[0] + 1);
  }
  if (local_d98[0] != local_d88) {
    operator_delete(local_d98[0],local_d88[0] + 1);
  }
  if (local_cf0[0] != local_ce0) {
    operator_delete(local_cf0[0],local_ce0[0] + 1);
  }
  if (local_cd0[0] != local_cc0) {
    operator_delete(local_cd0[0],local_cc0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_12e8);
  if (local_cb0[0] != local_ca0) {
    operator_delete(local_cb0[0],local_ca0[0] + 1);
  }
  if (local_c90[0] != local_c80) {
    operator_delete(local_c90[0],local_c80[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_12c8);
  if (local_c70[0] != local_c60) {
    operator_delete(local_c70[0],local_c60[0] + 1);
  }
  if (local_c50[0] != local_c40) {
    operator_delete(local_c50[0],local_c40[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_12a8);
  if (local_c10 != &local_c00) {
    operator_delete(local_c10,local_c00 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c30._M_dataplus._M_p != &local_c30.field_2) {
    operator_delete(local_c30._M_dataplus._M_p,local_c30.field_2._M_allocated_capacity + 1);
  }
  if (local_bf0[0] != local_be0) {
    operator_delete(local_bf0[0],local_be0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1288);
  if (local_bd0[0] != local_bc0) {
    operator_delete(local_bd0[0],local_bc0[0] + 1);
  }
  if (local_bb0[0] != local_ba0) {
    operator_delete(local_bb0[0],local_ba0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1268);
  if (local_b90[0] != local_b80) {
    operator_delete(local_b90[0],local_b80[0] + 1);
  }
  if (local_b70[0] != local_b60) {
    operator_delete(local_b70[0],local_b60[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1248);
  if (local_b50[0] != local_b40) {
    operator_delete(local_b50[0],local_b40[0] + 1);
  }
  if (local_b30[0] != local_b20) {
    operator_delete(local_b30[0],local_b20[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1228);
  if (local_b10[0] != local_b00) {
    operator_delete(local_b10[0],local_b00[0] + 1);
  }
  if (local_af0[0] != local_ae0) {
    operator_delete(local_af0[0],local_ae0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1208);
  if (local_ad0[0] != local_ac0) {
    operator_delete(local_ad0[0],local_ac0[0] + 1);
  }
  if (local_ab0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_ab0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_ab0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_ab0.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_11e8);
  if (local_a90[0] != local_a80) {
    operator_delete(local_a90[0],local_a80[0] + 1);
  }
  if (local_a70[0] != (pointer)local_a60) {
    operator_delete(local_a70[0],local_a60._0_8_ + 1);
  }
  if (*(vector<RPCResult,_std::allocator<RPCResult>_> **)(in_FS_OFFSET + 0x28) == local_38) {
    return *(vector<RPCResult,_std::allocator<RPCResult>_> **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static std::vector<RPCResult> TransactionDescriptionString()
{
    return{{RPCResult::Type::NUM, "confirmations", "The number of confirmations for the transaction. Negative confirmations means the\n"
               "transaction conflicted that many blocks ago."},
           {RPCResult::Type::BOOL, "generated", /*optional=*/true, "Only present if the transaction's only input is a coinbase one."},
           {RPCResult::Type::BOOL, "trusted", /*optional=*/true, "Whether we consider the transaction to be trusted and safe to spend from.\n"
                "Only present when the transaction has 0 confirmations (or negative confirmations, if conflicted)."},
           {RPCResult::Type::STR_HEX, "blockhash", /*optional=*/true, "The block hash containing the transaction."},
           {RPCResult::Type::NUM, "blockheight", /*optional=*/true, "The block height containing the transaction."},
           {RPCResult::Type::NUM, "blockindex", /*optional=*/true, "The index of the transaction in the block that includes it."},
           {RPCResult::Type::NUM_TIME, "blocktime", /*optional=*/true, "The block time expressed in " + UNIX_EPOCH_TIME + "."},
           {RPCResult::Type::STR_HEX, "txid", "The transaction id."},
           {RPCResult::Type::STR_HEX, "wtxid", "The hash of serialized transaction, including witness data."},
           {RPCResult::Type::ARR, "walletconflicts", "Confirmed transactions that have been detected by the wallet to conflict with this transaction.",
           {
               {RPCResult::Type::STR_HEX, "txid", "The transaction id."},
           }},
           {RPCResult::Type::STR_HEX, "replaced_by_txid", /*optional=*/true, "Only if 'category' is 'send'. The txid if this tx was replaced."},
           {RPCResult::Type::STR_HEX, "replaces_txid", /*optional=*/true, "Only if 'category' is 'send'. The txid if this tx replaces another."},
           {RPCResult::Type::ARR, "mempoolconflicts", "Transactions in the mempool that directly conflict with either this transaction or an ancestor transaction",
           {
               {RPCResult::Type::STR_HEX, "txid", "The transaction id."},
           }},
           {RPCResult::Type::STR, "to", /*optional=*/true, "If a comment to is associated with the transaction."},
           {RPCResult::Type::NUM_TIME, "time", "The transaction time expressed in " + UNIX_EPOCH_TIME + "."},
           {RPCResult::Type::NUM_TIME, "timereceived", "The time received expressed in " + UNIX_EPOCH_TIME + "."},
           {RPCResult::Type::STR, "comment", /*optional=*/true, "If a comment is associated with the transaction, only present if not empty."},
           {RPCResult::Type::STR, "bip125-replaceable", "(\"yes|no|unknown\") Whether this transaction signals BIP125 replaceability or has an unconfirmed ancestor signaling BIP125 replaceability.\n"
               "May be unknown for unconfirmed transactions not in the mempool because their unconfirmed ancestors are unknown."},
           {RPCResult::Type::ARR, "parent_descs", /*optional=*/true, "Only if 'category' is 'received'. List of parent descriptors for the output script of this coin.", {
               {RPCResult::Type::STR, "desc", "The descriptor string."},
           }},
           };
}